

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::ThreadSafeArena::AddCleanup
          (ThreadSafeArena *this,void *elem,_func_void_void_ptr *cleanup)

{
  ulong uVar1;
  CleanupNode *pCVar2;
  __int_type_conflict3 _Var3;
  long lVar4;
  CleanupNode *pCVar5;
  SerialArena *this_00;
  string *psVar6;
  CleanupNode *pCVar7;
  ulong uVar8;
  ThreadSafeArena *this_01;
  LogMessageFatal aLStack_58 [16];
  ThreadSafeArena *pTStack_48;
  
  this_01 = (ThreadSafeArena *)&stack0xffffffffffffffd8;
  lVar4 = __tls_get_addr(&PTR_004d49d0);
  if (*(uint64_t *)(lVar4 + 8) != this->tag_and_id_) goto LAB_001c51bd;
  this = *(ThreadSafeArena **)(lVar4 + 0x10);
  while( true ) {
    pCVar5 = (CleanupNode *)(this->head_)._M_b._M_p;
    if (pCVar5 < (CleanupNode *)this->first_owner_) {
      (this->head_)._M_b._M_p = (__pointer_type)(pCVar5 + 1);
      pCVar5->elem = elem;
      pCVar5->destructor = cleanup;
    }
    else {
      internal::cleanup::ChunkList::AddFallback
                ((ChunkList *)&this->mutex_,elem,cleanup,(SerialArena *)this);
    }
    pCVar5 = (CleanupNode *)(this->first_arena_).ptr_._M_b._M_p;
    if ((pCVar5 == (CleanupNode *)0x0) ||
       ((CleanupNode *)((ChunkList *)&this->mutex_)->head_ <= pCVar5)) break;
    AddCleanup((ThreadSafeArena *)&stack0xffffffffffffffd8);
LAB_001c51bd:
    this = (ThreadSafeArena *)GetSerialArenaFallback(this,0x10);
  }
  pCVar2 = (CleanupNode *)(this->head_)._M_b._M_p;
  if (((long)pCVar5 - (long)pCVar2 < 0x181) &&
     (pCVar7 = (CleanupNode *)this->first_owner_, pCVar5 < pCVar7)) {
    if (pCVar2 < pCVar5) {
      pCVar2 = pCVar5;
    }
    pCVar5 = pCVar2;
    if (pCVar5 == (CleanupNode *)0x0) {
      AddCleanup((ThreadSafeArena *)&stack0xffffffffffffffd8);
      pTStack_48 = this;
      lVar4 = __tls_get_addr(&PTR_004d49d0);
      if (*(uint64_t *)(lVar4 + 8) == this_01->tag_and_id_) {
        this_00 = *(SerialArena **)(lVar4 + 0x10);
      }
      else {
        this_00 = GetSerialArenaFallback(this_01,0x10);
      }
      _Var3 = (this_00->string_block_unused_).super___atomic_base<unsigned_long>._M_i;
      if (_Var3 != 0) {
        uVar1 = _Var3 - 0x20;
        (this_00->string_block_unused_).super___atomic_base<unsigned_long>._M_i = uVar1;
        uVar8 = (ulong)((this_00->string_block_)._M_b._M_p)->allocated_size_ - 0x10;
        if (uVar8 < uVar1) {
          psVar6 = absl::lts_20240722::log_internal::MakeCheckOpString<unsigned_long,unsigned_long>
                             (uVar1,uVar8,"offset <= effective_size()");
        }
        else {
          psVar6 = (string *)0x0;
        }
        if (psVar6 != (string *)0x0) {
          absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                    (aLStack_58,
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/string_block.h"
                     ,0xa2,*(undefined8 *)(psVar6 + 8),*(undefined8 *)psVar6);
          absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(aLStack_58);
        }
      }
      if (_Var3 == 0) {
        SerialArena::AllocateFromStringBlockFallback(this_00);
        return;
      }
      return;
    }
    if (pCVar5 + 0x18 < pCVar7) {
      pCVar7 = pCVar5 + 0x18;
    }
    for (; pCVar5 < pCVar7; pCVar5 = pCVar5 + 4) {
    }
  }
  (this->first_arena_).ptr_._M_b._M_p = (__pointer_type)pCVar5;
  return;
}

Assistant:

void ThreadSafeArena::AddCleanup(void* elem, void (*cleanup)(void*)) {
  GetSerialArena()->AddCleanup(elem, cleanup);
}